

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maybe.hpp
# Opt level: O3

maybe<(anonymous_namespace)::value,_void> * __thiscall
pstore::maybe<(anonymous_namespace)::value,void>::operator=
          (maybe<(anonymous_namespace)::value,void> *this,value *other)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  value *pvVar4;
  
  if (*this == (maybe<(anonymous_namespace)::value,void>)0x1) {
    peVar2 = (other->v_).super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var3 = (other->v_).super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    (other->v_).super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    (other->v_).super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    pvVar4 = maybe<(anonymous_namespace)::value,_void>::value
                       ((maybe<(anonymous_namespace)::value,_void> *)this);
    p_Var1 = (pvVar4->v_).super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    (pvVar4->v_).super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
    (pvVar4->v_).super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var3;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    }
  }
  else {
    *(undefined8 *)(this + 0x10) = 0;
    peVar2 = (other->v_).super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var1 = (other->v_).super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    (other->v_).super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    *(element_type **)(this + 8) = peVar2;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 0x10) = p_Var1;
    (other->v_).super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    *this = (maybe<(anonymous_namespace)::value,void>)0x1;
  }
  return (maybe<(anonymous_namespace)::value,_void> *)this;
}

Assistant:

maybe & operator= (U && other) noexcept (
            std::is_nothrow_copy_assignable<T>::value && std::is_nothrow_copy_constructible<
                T>::value && std::is_nothrow_move_assignable<T>::value &&
                std::is_nothrow_move_constructible<T>::value) {

            if (valid_) {
                T temp = std::forward<U> (other);
                std::swap (this->value (), temp);
            } else {
                new (&storage_) T (std::forward<U> (other));
                valid_ = true;
            }
            return *this;
        }